

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  long lVar1;
  
  if (0 < this->allocated_size_) {
    lVar1 = 0;
    do {
      if ((long *)this->elements_[lVar1] != (long *)0x0) {
        (**(code **)(*this->elements_[lVar1] + 8))();
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->allocated_size_);
  }
  if (this->elements_ != (void **)0x0) {
    operator_delete__(this->elements_);
    return;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Destroy() {
  for (int i = 0; i < allocated_size_; i++) {
    TypeHandler::Delete(cast<TypeHandler>(elements_[i]));
  }
  delete [] elements_;
}